

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::image_load
               (NegativeTestContext *ctx,TextureType imageType)

{
  MemoryQualifier memory;
  int memoryNdx;
  long lVar1;
  long lVar2;
  allocator<char> local_b9;
  string local_b8;
  TextureFormat local_98 [13];
  
  local_98[0].order = RGBA;
  local_98[0].type = FLOAT;
  local_98[1].order = RGBA;
  local_98[1].type = HALF_FLOAT;
  local_98[2].order = R;
  local_98[2].type = FLOAT;
  local_98[3].order = RGBA;
  local_98[3].type = UNORM_INT8;
  local_98[4].order = RGBA;
  local_98[4].type = SNORM_INT8;
  local_98[5].order = RGBA;
  local_98[5].type = SIGNED_INT32;
  local_98[6].order = RGBA;
  local_98[6].type = SIGNED_INT16;
  local_98[7].order = RGBA;
  local_98[7].type = SIGNED_INT8;
  local_98[8].order = R;
  local_98[8].type = SIGNED_INT32;
  local_98[9].order = RGBA;
  local_98[9].type = UNSIGNED_INT32;
  local_98[10].order = RGBA;
  local_98[10].type = UNSIGNED_INT16;
  local_98[0xb].order = RGBA;
  local_98[0xb].type = UNSIGNED_INT8;
  local_98[0xc].order = R;
  local_98[0xc].type = UNSIGNED_INT32;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"It is an error to pass a writeonly image to imageLoad.",&local_b9)
  ;
  NegativeTestContext::beginSection(ctx,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    memory = (&DAT_018ca570)[lVar1];
    for (lVar2 = 0; lVar2 != 0x68; lVar2 = lVar2 + 8) {
      testShader(ctx,IMAGE_OPERATION_LOAD,memory,imageType,
                 (TextureFormat *)((long)&local_98[0].order + lVar2));
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void image_load (NegativeTestContext& ctx, glu::TextureTestUtil::TextureType imageType)
{
	const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::HALF_FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SNORM_INT8),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT32),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::UNSIGNED_INT32)
	};

	const MemoryQualifier memoryOptions[] =
	{
		MEMORY_WRITEONLY,
		MEMORY_BOTH
	};

	ctx.beginSection("It is an error to pass a writeonly image to imageLoad.");
	for (int memoryNdx = 0; memoryNdx < DE_LENGTH_OF_ARRAY(memoryOptions); ++memoryNdx)
	{
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(formats); ++fmtNdx)
		{
			testShader(ctx, IMAGE_OPERATION_LOAD, memoryOptions[memoryNdx], imageType, formats[fmtNdx]);
		}
	}
	ctx.endSection();
}